

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

bool ExecuteCommands(vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *commands,
                    JSONRPCRequest *request,UniValue *result)

{
  pointer ppCVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  undefined4 *puVar3;
  VType *pVVar4;
  pointer pcVar5;
  string key;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  undefined1 auVar6 [16];
  char cVar7;
  bool bVar8;
  pointer pUVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar11;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
  __it;
  UniValue *pUVar12;
  UniValue *pUVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  undefined8 *puVar15;
  pointer pUVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  string *argName;
  int iVar18;
  long lVar19;
  pointer pbVar20;
  char *in_R8;
  ulong uVar21;
  size_t index;
  long lVar22;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_false,_true>,_bool>
  pVar23;
  undefined1 auVar24 [16];
  string_view separators;
  RPCCommandExecution execution;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vargNames;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>_>
  argsIn;
  size_t i;
  node_type positional_args;
  undefined4 in_stack_fffffffffffffa78;
  int iVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar26;
  UniValue *pUVar27;
  pointer pUVar28;
  JSONRPCRequest *pJVar29;
  UniValue *pUVar30;
  string *method;
  pointer pUVar31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar32;
  iterator in_stack_fffffffffffffae0;
  pointer in_stack_fffffffffffffae8;
  pointer pUVar33;
  pointer local_510;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_500;
  JSONRPCRequest local_4c8;
  VType local_370;
  long *local_368 [2];
  long local_358 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  vector<UniValue,_std::allocator<UniValue>_> local_330;
  undefined1 *local_318;
  undefined8 local_310;
  undefined1 local_308;
  uint7 uStack_307;
  pointer pcStack_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  undefined1 auStack_2e0 [16];
  undefined1 local_2d0 [24];
  vector<UniValue,_std::allocator<UniValue>_> vStack_2b8;
  VType local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  pointer local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  vector<UniValue,_std::allocator<UniValue>_> local_258;
  undefined4 local_240;
  long *local_238 [2];
  long local_228 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  vector<UniValue,_std::allocator<UniValue>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined4 local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  vector<UniValue,_std::allocator<UniValue>_> vStack_188;
  undefined4 local_170;
  long *local_168 [2];
  long local_158 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<UniValue,_std::allocator<UniValue>_> local_130;
  long *local_118 [2];
  long local_108 [2];
  undefined1 local_f8 [16];
  undefined1 local_e8 [24];
  pointer local_d0;
  pointer local_c8;
  undefined1 local_c0 [40];
  pointer pUStack_98;
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  undefined1 auStack_78 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<UniValue,_std::allocator<UniValue>_> vStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pUVar9 = (pointer)(commands->
                    super__Vector_base<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
  pUVar31 = (pointer)(commands->
                     super__Vector_base<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
  if (pUVar9 != pUVar31) {
    method = &request->strMethod;
    pUVar27 = &local_4c8.params;
    pUVar12 = &request->params;
    do {
      lVar26 = *(long *)pUVar9;
      ppCVar1 = (commands->
                super__Vector_base<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      pUVar30 = pUVar12;
      RPCCommandExecution::RPCCommandExecution
                ((RPCCommandExecution *)&stack0xfffffffffffffae0,method);
      pUVar28 = (pointer)(ppCVar1 + -1);
      if (pUVar12->typ == VOBJ) {
        JSONRPCRequest::JSONRPCRequest(&local_4c8,request);
        local_90._0_4_ = 2;
        local_90._8_8_ = local_80 + 8;
        local_c0._16_8_ = local_c0 + 0x20;
        auStack_78._0_8_ = (ulong)(uint7)local_c0._33_7_ << 8;
        auStack_78._8_8_ = pUStack_98;
        local_80 = (undefined1  [8])0x0;
        local_c0._24_8_ = 0;
        local_c0[0x20] = '\0';
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4c8.params.typ = VARR;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_4c8.params.val,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_90 + 8));
        local_2e8 = (undefined1  [8])
                    local_4c8.params.keys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2f8._8_8_ =
             local_4c8.params.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_2f8._0_8_ =
             local_4c8.params.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_4c8.params.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_4c8.params.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_4c8.params.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2f8);
        local_2e8 = (undefined1  [8])
                    local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2f8._8_8_ =
             local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_2f8._0_8_ =
             local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start =
             vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish =
             vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                  ((vector<UniValue,_std::allocator<UniValue>_> *)local_2f8);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        if ((pointer)local_90._8_8_ != (pointer)(local_80 + 8)) {
          operator_delete((void *)local_90._8_8_,(ulong)(auStack_78._0_8_ + 1));
        }
        if ((pointer)local_c0._16_8_ != (pointer)(local_c0 + 0x20)) {
          operator_delete((void *)local_c0._16_8_,CONCAT71(local_c0._33_7_,local_c0[0x20]) + 1);
        }
        pvVar10 = UniValue::getKeys_abi_cxx11_(pUVar12);
        pvVar11 = UniValue::getValues(pUVar12);
        local_500._M_buckets = &local_500._M_single_bucket;
        local_500._M_bucket_count = 1;
        local_500._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_500._M_element_count = 0;
        local_500._M_rehash_policy._M_max_load_factor = 1.0;
        local_500._M_rehash_policy._M_next_resize = 0;
        local_500._M_single_bucket = (__node_base_ptr)0x0;
        pbVar20 = (pvVar10->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((pvVar10->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish != pbVar20) {
          lVar19 = 0;
          lVar22 = 0;
          uVar21 = 0;
          do {
            local_90._0_8_ =
                 (long)&((pvVar11->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                         super__Vector_impl_data._M_start)->typ + lVar19;
            pVar23 = std::
                     _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,UniValue_const*>,std::allocator<std::pair<std::__cxx11::string_const,UniValue_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                     ::_M_emplace<std::__cxx11::string_const&,UniValue_const*>
                               ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,UniValue_const*>,std::allocator<std::pair<std::__cxx11::string_const,UniValue_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                 *)&local_500,(long)&(pbVar20->_M_dataplus)._M_p + lVar22,local_90);
            if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2f8,"Parameter ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&(((pvVar10->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar22));
              pbVar14 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2f8," specified multiple times");
              local_90._0_8_ = (pbVar14->_M_dataplus)._M_p;
              paVar17 = &pbVar14->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._0_8_ == paVar17) {
                local_80 = (undefined1  [8])paVar17->_M_allocated_capacity;
                auStack_78._0_8_ = *(ulong *)((long)&pbVar14->field_2 + 8);
                local_90._0_8_ = (pointer)(local_90 + 0x10);
              }
              else {
                local_80 = (undefined1  [8])paVar17->_M_allocated_capacity;
              }
              local_90._8_8_ = pbVar14->_M_string_length;
              (pbVar14->_M_dataplus)._M_p = (pointer)paVar17;
              pbVar14->_M_string_length = 0;
              (pbVar14->field_2)._M_local_buf[0] = '\0';
              JSONRPCError(pUVar12,-8,(string *)local_90);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
              }
              goto LAB_00aad1dd;
            }
            uVar21 = uVar21 + 1;
            pbVar20 = (pvVar10->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar22 = lVar22 + 0x20;
            lVar19 = lVar19 + 0x58;
          } while (uVar21 < (ulong)((long)(pvVar10->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pbVar20 >> 5));
        }
        local_90._0_4_ = 1;
        local_90._8_8_ = local_80 + 8;
        pUVar16 = (pointer)local_c0;
        auStack_78._0_8_ = (ulong)(uint7)local_c0._1_7_ << 8;
        auStack_78._8_8_ = local_c0._8_8_;
        local_80 = (undefined1  [8])0x0;
        local_c8 = (pointer)0x0;
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_c0[0] = VNULL;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pbVar14 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   (lVar26 + 0x60);
        pbVar32 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   (lVar26 + 0x68);
        iVar25 = 0;
        local_d0 = pUVar16;
        if (pbVar14 != pbVar32) {
          iVar18 = 0;
          iVar25 = 0;
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          do {
            local_2f8._0_8_ = (pbVar14->_M_dataplus)._M_p;
            local_2f8._8_8_ = pbVar14->_M_string_length;
            local_f8[0] = 0x7c;
            pUVar16 = (pointer)local_f8;
            separators._M_str = in_R8;
            separators._M_len = (size_t)pUVar16;
            util::Split<std::__cxx11::string>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xfffffffffffffae8,(util *)local_2f8,(Span<const_char> *)0x1,
                       separators);
            pUVar13 = pUVar27;
            pUVar33 = in_stack_fffffffffffffae8;
            for (; in_stack_fffffffffffffae8 != local_510;
                in_stack_fffffffffffffae8 =
                     (pointer)((in_stack_fffffffffffffae8->val).field_2._M_local_buf + 8)) {
              __it._M_cur = (__node_type *)
                            std::
                            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            ::find(&local_500,(key_type *)in_stack_fffffffffffffae8);
              if (__it._M_cur != (__node_type *)0x0) goto LAB_00aabbfc;
            }
            __it._M_cur = (__node_type *)0x0;
LAB_00aabbfc:
            in_stack_fffffffffffffae8 = pUVar33;
            pUVar27 = pUVar13;
            if (*(char *)&pbVar14[1]._M_dataplus._M_p == '\x01') {
              if (__it._M_cur != (__node_type *)0x0) {
                pUVar12 = (UniValue *)
                          &(__it._M_cur)->
                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                ;
                bVar8 = UniValue::findKey((UniValue *)local_90,(string *)pUVar12,(size_t *)local_2f8
                                         );
                if (bVar8) goto LAB_00aac6d4;
                local_118[0] = local_108;
                aVar2 = ((__it._M_cur)->
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>
                        ._M_storage._M_storage.__align;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_118,aVar2,
                           *(long *)((long)&((__it._M_cur)->
                                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>
                                            ._M_storage._M_storage + 8) + (long)aVar2);
                puVar3 = *(undefined4 **)
                          ((long)&((__it._M_cur)->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>
                                  ._M_storage._M_storage + 0x20);
                local_170 = *puVar3;
                local_168[0] = local_158;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_168,*(long *)(puVar3 + 2),
                           *(long *)(puVar3 + 4) + *(long *)(puVar3 + 2));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_148,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(puVar3 + 10));
                std::vector<UniValue,_std::allocator<UniValue>_>::vector
                          (&local_130,(vector<UniValue,_std::allocator<UniValue>_> *)(puVar3 + 0x10)
                          );
                key._M_dataplus._M_p._4_4_ = iVar25;
                key._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa78;
                key._M_string_length = (size_type)__rhs;
                key.field_2._M_allocated_capacity = lVar26;
                key.field_2._8_8_ = pUVar9;
                val_03.val._M_dataplus._M_p = (pointer)pUVar13;
                val_03._0_8_ = result;
                val_03.val._M_string_length = (size_type)pUVar28;
                val_03.val.field_2._M_allocated_capacity = (size_type)request;
                val_03.val.field_2._8_8_ = pUVar30;
                val_03.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = method;
                val_03.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar31;
                val_03.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)commands;
                val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pbVar32;
                val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffae0._M_node;
                val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffae8;
                UniValue::pushKVEnd((UniValue *)local_90,key,val_03);
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_130);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_148);
                pUVar27 = pUVar13;
                if (local_168[0] != local_158) {
                  operator_delete(local_168[0],local_158[0] + 1);
                  pUVar27 = pUVar13;
                }
                if (local_118[0] != local_108) {
                  operator_delete(local_118[0],local_108[0] + 1);
                }
                std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::erase(&local_500,(const_iterator)__it._M_cur);
              }
            }
            else {
              if ((vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_finish ==
                   vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_start) && (__it._M_cur == (__node_type *)0x0)) {
                iVar18 = iVar18 + 1;
                if (local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  iVar25 = iVar18;
                }
              }
              else {
                if (0 < iVar18) {
                  do {
                    local_1b8 = 0;
                    local_1b0 = 0;
                    local_1c8 = 0;
                    vStack_188.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    vStack_188.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_1a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    vStack_188.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    local_1a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_1a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    val._4_4_ = iVar25;
                    val.typ = in_stack_fffffffffffffa78;
                    val.val._M_dataplus._M_p = (pointer)__rhs;
                    val.val._M_string_length = lVar26;
                    val.val.field_2._M_allocated_capacity = (size_type)pUVar9;
                    val.val.field_2._8_8_ = result;
                    val.keys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)pUVar27;
                    val.keys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar28;
                    val.keys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)request;
                    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_start = pUVar30;
                    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)method;
                    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = pUVar31;
                    local_1c0 = &local_1b0;
                    UniValue::push_back(pUVar13,val);
                    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_188);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_1a0);
                    if (local_1c0 != &local_1b0) {
                      operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
                    }
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
                if (__rhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0) {
                  __rhs = pbVar14;
                }
                iVar18 = 0;
                if (__it._M_cur != (__node_type *)0x0) {
                  if (vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
                    std::operator+(&local_1e8,"Parameter ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&(__it._M_cur)->
                                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                                  );
                    pbVar14 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              append(&local_1e8," conflicts with parameter ");
                    local_f8._0_8_ = (pbVar14->_M_dataplus)._M_p;
                    paVar17 = &pbVar14->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f8._0_8_ == paVar17) {
                      local_e8._0_8_ = paVar17->_M_allocated_capacity;
                      local_e8._8_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
                      local_f8._0_8_ = (pointer)(local_f8 + 0x10);
                    }
                    else {
                      local_e8._0_8_ = paVar17->_M_allocated_capacity;
                    }
                    local_f8._8_8_ = pbVar14->_M_string_length;
                    (pbVar14->_M_dataplus)._M_p = (pointer)paVar17;
                    pbVar14->_M_string_length = 0;
                    (pbVar14->field_2)._M_local_buf[0] = '\0';
                    pvVar10 = UniValue::getKeys_abi_cxx11_((UniValue *)local_90);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2f8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_f8,
                                   (pvVar10->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
                    JSONRPCError(pUVar12,-8,(string *)local_2f8);
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
                    }
                    goto LAB_00aad1dd;
                  }
                  puVar3 = *(undefined4 **)
                            ((long)&((__it._M_cur)->
                                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>
                                    ._M_storage._M_storage + 0x20);
                  local_240 = *puVar3;
                  local_238[0] = local_228;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_238,*(long *)(puVar3 + 2),
                             *(long *)(puVar3 + 4) + *(long *)(puVar3 + 2));
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_218,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(puVar3 + 10));
                  std::vector<UniValue,_std::allocator<UniValue>_>::vector
                            (&local_200,
                             (vector<UniValue,_std::allocator<UniValue>_> *)(puVar3 + 0x10));
                  val_00._4_4_ = iVar25;
                  val_00.typ = in_stack_fffffffffffffa78;
                  val_00.val._M_dataplus._M_p = (pointer)__rhs;
                  val_00.val._M_string_length = lVar26;
                  val_00.val.field_2._M_allocated_capacity = (size_type)pUVar9;
                  val_00.val.field_2._8_8_ = result;
                  val_00.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)pUVar27;
                  val_00.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar28;
                  val_00.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)request;
                  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start = pUVar30;
                  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)method;
                  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = pUVar31;
                  UniValue::push_back(pUVar13,val_00);
                  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_200);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_218);
                  if (local_238[0] != local_228) {
                    operator_delete(local_238[0],local_228[0] + 1);
                  }
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::erase(&local_500,(const_iterator)__it._M_cur);
                  iVar18 = 0;
                }
              }
              pUVar16 = vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              pUVar33 = vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                local_298 = local_90._0_4_;
                local_290 = &local_280;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._8_8_ ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_80 + 8)) {
                  local_280._8_8_ = auStack_78._8_8_;
                }
                else {
                  local_290 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_90._8_8_;
                }
                local_280._M_allocated_capacity = auStack_78._0_8_;
                local_288 = (pointer)local_80;
                local_80 = (undefined1  [8])0x0;
                auStack_78._0_8_ = auStack_78._0_8_ & 0xffffffffffffff00;
                local_270.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_270.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_270.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_258.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                val_01._4_4_ = iVar25;
                val_01.typ = in_stack_fffffffffffffa78;
                val_01.val._M_dataplus._M_p = (pointer)__rhs;
                val_01.val._M_string_length = lVar26;
                val_01.val.field_2._M_allocated_capacity = (size_type)pUVar9;
                val_01.val.field_2._8_8_ = result;
                val_01.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pUVar27;
                val_01.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar28;
                val_01.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)request;
                val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = pUVar30;
                val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)method;
                val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = pUVar31;
                local_258.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = pUVar33;
                local_258.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = pUVar16;
                local_90._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_80 + 8);
                UniValue::push_back(pUVar13,val_01);
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_258);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_270);
                if (local_290 != &local_280) {
                  operator_delete(local_290,(ulong)(local_280._M_allocated_capacity + 1));
                }
                local_2f8._0_4_ = 1;
                local_2f8._8_8_ = auStack_2e0;
                local_318 = &local_308;
                auStack_2e0._0_8_ = (ulong)uStack_307 << 8;
                auStack_2e0._8_8_ = pcStack_300;
                local_2e8 = (undefined1  [8])0x0;
                local_310 = 0;
                local_308 = 0;
                vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_2d0._16_8_ = (pointer)0x0;
                vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_2d0._0_8_ = (pointer)0x0;
                local_2d0._8_8_ = (pointer)0x0;
                local_90._0_4_ = 1;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_90 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_2f8 + 8));
                local_e8._0_8_ =
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_f8._8_8_ =
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_f8._0_8_ =
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2d0._16_8_;
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2d0._0_8_;
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2d0._8_8_;
                local_2d0._16_8_ = (pointer)0x0;
                local_2d0._0_8_ = (pointer)0x0;
                local_2d0._8_8_ = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_f8);
                local_e8._0_8_ =
                     vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_f8._8_8_ =
                     vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_f8._0_8_ =
                     vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_start;
                pUVar16 = vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage;
                vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start =
                     vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_start;
                vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                          ((vector<UniValue,_std::allocator<UniValue>_> *)local_f8);
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2d0);
                if ((pointer)local_2f8._8_8_ != (pointer)auStack_2e0) {
                  operator_delete((void *)local_2f8._8_8_,(ulong)(auStack_2e0._0_8_ + 1));
                }
                if (local_318 != &local_308) {
                  operator_delete(local_318,CONCAT71(uStack_307,local_308) + 1);
                }
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&stack0xfffffffffffffae8);
            pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &pbVar14[1]._M_string_length;
          } while (pbVar14 != pbVar32);
        }
        local_2f8._8_8_ = (pointer)0x4;
        local_2e8._0_5_ = 0x73677261;
        local_2f8._0_8_ = (pointer)local_2e8;
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::extract((node_type *)&local_1e8,&local_500,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
        if ((pointer)local_2f8._0_8_ != (pointer)local_2e8) {
          operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
        }
        if ((local_1e8._M_dataplus._M_p != (pointer)0x0) &&
           (pUVar16 = *(pointer *)local_1e8.field_2._M_allocated_capacity,
           *(int *)&pUVar16->typ == 2)) {
          if ((iVar25 < (int)((ulong)((long)(pUVar16->values).
                                            super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pUVar16->values).
                                           super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x45d1745d) &&
             (__rhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f8,"Parameter ",__rhs);
            pbVar14 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_f8,
                                 " specified twice both as positional and named argument");
            local_2f8._0_8_ = (pbVar14->_M_dataplus)._M_p;
            paVar17 = &pbVar14->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._0_8_ == paVar17) {
              local_2e8 = (undefined1  [8])paVar17->_M_allocated_capacity;
              auStack_2e0._0_8_ = *(long *)((long)&pbVar14->field_2 + 8);
              local_2f8._0_8_ = (pointer)local_2e8;
            }
            else {
              local_2e8 = (undefined1  [8])paVar17->_M_allocated_capacity;
            }
            local_2f8._8_8_ = pbVar14->_M_string_length;
            (pbVar14->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar14->_M_string_length = 0;
            (pbVar14->field_2)._M_local_buf[0] = '\0';
            JSONRPCError(pUVar12,-8,(string *)local_2f8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00aad1dd;
          }
          local_2f8._0_4_ = local_4c8.params.typ;
          paVar17 = &local_4c8.params.val.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8.params.val._M_dataplus._M_p == paVar17) {
            auStack_2e0._8_8_ = local_4c8.params.val.field_2._8_8_;
            local_2f8._8_8_ = (pointer)auStack_2e0;
          }
          else {
            local_2f8._8_8_ = local_4c8.params.val._M_dataplus._M_p;
          }
          auStack_2e0._1_7_ = local_4c8.params.val.field_2._M_allocated_capacity._1_7_;
          auStack_2e0[0] = local_4c8.params.val.field_2._M_local_buf[0];
          local_2e8 = (undefined1  [8])local_4c8.params.val._M_string_length;
          local_4c8.params.val._M_string_length = 0;
          local_4c8.params.val.field_2._M_local_buf[0] = '\0';
          local_2d0._0_8_ =
               local_4c8.params.keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_2d0._8_8_ =
               local_4c8.params.keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_2d0._16_8_ =
               local_4c8.params.keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_4c8.params.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_4c8.params.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_4c8.params.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
               _M_impl.super__Vector_impl_data._M_start;
          vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          pUVar16 = (pointer)&local_4c8.params.values;
          local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_4c8.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pVVar4 = *(VType **)local_1e8.field_2._M_allocated_capacity;
          local_4c8.params.typ = *pVVar4;
          pJVar29 = request;
          local_4c8.params.val._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_4c8.params.val,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (pVVar4 + 2));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&local_4c8.params.keys,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(pVVar4 + 10));
          std::vector<UniValue,_std::allocator<UniValue>_>::operator=
                    (&local_4c8.params.values,
                     (vector<UniValue,_std::allocator<UniValue>_> *)(pVVar4 + 0x10));
          if ((ulong)((long)local_4c8.params.values.
                            super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_4c8.params.values.
                           super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                           super__Vector_impl_data._M_start) <
              (ulong)((long)vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                           _M_impl.super__Vector_impl_data._M_start)) {
            index = ((long)local_4c8.params.values.
                           super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_4c8.params.values.
                           super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
            do {
              pUVar12 = UniValue::operator[]((UniValue *)local_2f8,index);
              local_370 = pUVar12->typ;
              pcVar5 = (pUVar12->val)._M_dataplus._M_p;
              local_368[0] = local_358;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_368,pcVar5,pcVar5 + (pUVar12->val)._M_string_length);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_348,&pUVar12->keys);
              std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_330,&pUVar12->values);
              val_02._4_4_ = iVar25;
              val_02.typ = in_stack_fffffffffffffa78;
              val_02.val._M_dataplus._M_p = (pointer)__rhs;
              val_02.val._M_string_length = lVar26;
              val_02.val.field_2._M_allocated_capacity = (size_type)pUVar9;
              val_02.val.field_2._8_8_ = result;
              val_02.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)pUVar27;
              val_02.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar28;
              val_02.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pJVar29;
              val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = pUVar30;
              val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)method;
              val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = pUVar31;
              UniValue::push_back(pUVar27,val_02);
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_330);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_348);
              if (local_368[0] != local_358) {
                operator_delete(local_368[0],local_358[0] + 1);
              }
              index = index + 1;
              pUVar16 = (pointer)&DAT_2e8ba2e8ba2e8ba3;
            } while (index < (ulong)(((long)vStack_2b8.
                                            super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)vStack_2b8.
                                            super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3) *
                                    0x2e8ba2e8ba2e8ba3));
          }
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2d0);
          if ((pointer)local_2f8._8_8_ != (pointer)auStack_2e0) {
            operator_delete((void *)local_2f8._8_8_,(ulong)(auStack_2e0._0_8_ + 1));
          }
        }
        if (local_500._M_element_count != 0) {
          pUVar12 = (UniValue *)__cxa_allocate_exception(0x58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f8,"Unknown named parameter ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_500._M_before_begin._M_nxt + 1));
          JSONRPCError(pUVar12,-8,(string *)local_2f8);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar12,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00aad1dd;
        }
        pUVar13 = (UniValue *)0x2;
        if (local_1e8._M_dataplus._M_p != (pointer)0x0) {
          std::
          _Node_handle_common<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>_>_>
          ::_M_reset((_Node_handle_common<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>_>_>
                      *)&local_1e8);
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_80 + 8)) {
          operator_delete((void *)local_90._8_8_,(ulong)(auStack_78._0_8_ + 1));
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_500);
        local_90[0] = pUVar9 == pUVar28;
        if (*(long *)(lVar26 + 0x50) == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            auVar24 = std::__throw_bad_function_call();
            goto LAB_00aac8b6;
          }
          goto LAB_00aad1dd;
        }
        cVar7 = (**(code **)(lVar26 + 0x58))(lVar26 + 0x40,&local_4c8,result,local_90);
        JSONRPCRequest::~JSONRPCRequest(&local_4c8);
      }
      else {
        local_90[0] = pUVar9 == pUVar28;
        if (*(long *)(lVar26 + 0x50) == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_function_call();
LAB_00aac6d4:
            pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f8,"Parameter ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pUVar12);
            pbVar14 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_f8," specified multiple times");
            auVar6._8_8_ = local_2e8;
            auVar6._0_8_ = pbVar14;
            pcVar5 = (pbVar14->_M_dataplus)._M_p;
            auVar24._8_8_ = pcVar5;
            auVar24._0_8_ = pbVar14;
            pUVar16 = (pointer)&pbVar14->field_2;
            if ((pointer)pcVar5 == pUVar16) {
              local_2e8 = *(undefined1 (*) [8])pUVar16;
              auStack_2e0._0_8_ = *(long *)((long)&pbVar14->field_2 + 8);
              auVar24 = auVar6;
            }
            else {
LAB_00aac8b6:
              local_2e8 = *(undefined1 (*) [8])pUVar16;
            }
            local_2f8._0_8_ = auVar24._8_8_;
            puVar15 = auVar24._0_8_;
            local_2f8._8_8_ = puVar15[1];
            *puVar15 = pUVar16;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            JSONRPCError(pUVar13,-8,(string *)local_2f8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar13,&UniValue::typeinfo,UniValue::~UniValue);
            }
          }
          goto LAB_00aad1dd;
        }
        cVar7 = (**(code **)(lVar26 + 0x58))(lVar26 + 0x40,request,result,local_90);
      }
      RPCCommandExecution::~RPCCommandExecution((RPCCommandExecution *)&stack0xfffffffffffffae0);
      if (cVar7 != '\0') {
        bVar8 = true;
        goto LAB_00aac629;
      }
      pUVar9 = (pointer)&pUVar9->val;
      pUVar12 = pUVar30;
    } while (pUVar9 != pUVar31);
  }
  bVar8 = false;
LAB_00aac629:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
LAB_00aad1dd:
  __stack_chk_fail();
}

Assistant:

static bool ExecuteCommands(const std::vector<const CRPCCommand*>& commands, const JSONRPCRequest& request, UniValue& result)
{
    for (const auto& command : commands) {
        if (ExecuteCommand(*command, request, result, &command == &commands.back())) {
            return true;
        }
    }
    return false;
}